

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O2

void Projection::Initialize(void)

{
  ostringstream *poVar1;
  int iVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  ParmParse pp;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  old_proj;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> param;
  ParmParse local_260;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  allocator local_1d8 [32];
  Print local_1b8;
  
  if ((anonymous_namespace)::initialized == '\0') {
    std::__cxx11::string::string((string *)&local_1b8,"nodal_proj",(allocator *)&local_208);
    amrex::ParmParse::ParmParse(&local_260,(string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    amrex::ParmParse::query(&local_260,"verbose",&verbose,0);
    amrex::ParmParse::query(&local_260,"proj_tol",&proj_tol,0);
    amrex::ParmParse::query(&local_260,"sync_tol",&sync_tol,0);
    amrex::ParmParse::query(&local_260,"proj_abs_tol",&proj_abs_tol,0);
    amrex::ParmParse::query
              (&local_260,"benchmarking",(bool *)&(anonymous_namespace)::benchmarking,0);
    amrex::ParmParse::query(&local_260,"add_vort_proj",&add_vort_proj,0);
    amrex::ParmParse::query(&local_260,"do_outflow_bcs",&do_outflow_bcs,0);
    amrex::ParmParse::query(&local_260,"rho_wgt_vel_proj",&rho_wgt_vel_proj,0);
    amrex::ParmParse::query
              (&local_260,"agglomeration",(bool *)&(anonymous_namespace)::agglomeration,0);
    amrex::ParmParse::query
              (&local_260,"consolidation",(bool *)&(anonymous_namespace)::consolidation,0);
    amrex::ParmParse::query(&local_260,"max_fmg_iter",&(anonymous_namespace)::max_fmg_iter,0);
    amrex::ParmParse::query
              (&local_260,"use_gauss_seidel",(bool *)&(anonymous_namespace)::use_gauss_seidel,0);
    amrex::ParmParse::query
              (&local_260,"use_harmonic_average",
               (bool *)&(anonymous_namespace)::use_harmonic_average,0);
    amrex::ParmParse::query
              (&local_260,"mg_max_coarsening_level",&(anonymous_namespace)::max_coarsening_level,0);
    std::__cxx11::string::string((string *)&local_1b8,"v",(allocator *)&local_208);
    iVar2 = amrex::ParmParse::countname(&local_260,(string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    if (0 < iVar2) {
      amrex::Abort_host("nodal_proj.v found in inputs. To set verbosity use nodal_proj.verbose");
    }
    std::__cxx11::string::string((string *)&local_1b8,"proj",local_1d8);
    amrex::ParmParse::getEntries
              ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_208,(string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    if (local_208._M_impl.super__Rb_tree_header._M_node_count != 0) {
      poVar3 = amrex::OutStream();
      amrex::Print::Print(&local_1b8,poVar3);
      std::operator<<((ostream *)&local_1b8.ss,
                      "All runtime options related to the nodal projection now use \'nodal_proj\'.\n"
                     );
      std::operator<<((ostream *)&local_1b8.ss,
                      "Found these depreciated entries in the parameters list: \n");
      amrex::Print::~Print(&local_1b8);
      poVar1 = &local_1b8.ss;
      for (p_Var4 = local_208._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var4 != &local_208._M_impl.super__Rb_tree_header;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
        std::__cxx11::string::string((string *)local_1d8,(string *)(p_Var4 + 1));
        poVar3 = amrex::OutStream();
        amrex::Print::Print(&local_1b8,poVar3);
        std::operator<<((ostream *)poVar1,"  ");
        std::operator<<((ostream *)poVar1,(string *)local_1d8);
        std::operator<<((ostream *)poVar1,"\n");
        amrex::Print::~Print(&local_1b8);
        std::__cxx11::string::~string((string *)local_1d8);
      }
      amrex::Abort_host("Replace \'proj\' prefix with \'nodal_proj\' in inputs");
    }
    amrex::ExecOnFinalize((PTR_TO_VOID_FUNC)0x347425);
    (anonymous_namespace)::initialized = '\x01';
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_208);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_260);
  }
  return;
}

Assistant:

void
Projection::Initialize ()
{
    if (initialized) return;

    ParmParse pp("nodal_proj");

    pp.query("verbose",             verbose);
    pp.query("proj_tol",            proj_tol);
    pp.query("sync_tol",            sync_tol);
    pp.query("proj_abs_tol",        proj_abs_tol);
    pp.query("benchmarking",        benchmarking);
    pp.query("add_vort_proj",       add_vort_proj);
    pp.query("do_outflow_bcs",      do_outflow_bcs);
    pp.query("rho_wgt_vel_proj",    rho_wgt_vel_proj);

    pp.query("agglomeration",       agglomeration);
    pp.query("consolidation",       consolidation);
    pp.query("max_fmg_iter",        max_fmg_iter);
    pp.query("use_gauss_seidel",    use_gauss_seidel);
    pp.query("use_harmonic_average", use_harmonic_average);
    pp.query("mg_max_coarsening_level", max_coarsening_level);


    // Abort if old verbose flag is found
    if ( pp.countname("v") > 0 ) {
	amrex::Abort("nodal_proj.v found in inputs. To set verbosity use nodal_proj.verbose");
    }
    // Abort if old "proj." prefix is used.
    std::set<std::string> old_proj = ParmParse::getEntries("proj");
    if (!old_proj.empty()){
	Print()<<"All runtime options related to the nodal projection now use 'nodal_proj'.\n"
	       <<"Found these depreciated entries in the parameters list: \n";
	for ( auto param : old_proj ) {
	    Print()<<"  "<<param<<"\n";
	}
	amrex::Abort("Replace 'proj' prefix with 'nodal_proj' in inputs");
    }
	
    amrex::ExecOnFinalize(Projection::Finalize);

    initialized = true;
}